

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O2

void Gudhi::persistence_matrix::swap
               (Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *col1,Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                      *col2)

{
  Dimension DVar1;
  ID_index IVar2;
  Index IVar3;
  uint uVar4;
  Field_operators *pFVar5;
  Entry_constructor *pEVar6;
  
  DVar1 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar1;
  IVar2 = (col1->super_Chain_column_option).pivot_;
  (col1->super_Chain_column_option).pivot_ = (col2->super_Chain_column_option).pivot_;
  (col2->super_Chain_column_option).pivot_ = IVar2;
  IVar3 = (col1->super_Chain_column_option).pairedColumn_;
  (col1->super_Chain_column_option).pairedColumn_ = (col2->super_Chain_column_option).pairedColumn_;
  (col2->super_Chain_column_option).pairedColumn_ = IVar3;
  std::
  _Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&col1->column_,(_Vector_impl_data *)&col2->column_);
  uVar4 = col1->insertsSinceLastPrune_;
  col1->insertsSinceLastPrune_ = col2->insertsSinceLastPrune_;
  col2->insertsSinceLastPrune_ = uVar4;
  pFVar5 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar5;
  pEVar6 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar6;
  return;
}

Assistant:

void swap(Heap_column& col1, Heap_column& col2) {
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.insertsSinceLastPrune_, col2.insertsSinceLastPrune_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }